

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O1

void If_ManComputeSwitching(If_Man_t *pIfMan)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pIfMan->vSwitching != (Vec_Int_t *)0x0) {
    __assert_fail("pIfMan->vSwitching == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                  ,0x42,"void If_ManComputeSwitching(If_Man_t *)");
  }
  p = Gia_ManStart(pIfMan->vObjs->nSize);
  iVar3 = pIfMan->vObjs->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar11 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar11;
  local_38 = lVar15;
  if (iVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar5->pArray = piVar6;
  Vec_IntPush(pVVar5,1);
  if (0 < pIfMan->vCis->nSize) {
    iVar3 = 0;
    do {
      pGVar7 = Gia_ManAppendObj(p);
      uVar9 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar9 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar9 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p->nObjs <= pGVar7)) goto LAB_002c726c;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p->nObjs <= pGVar7)) goto LAB_002c726c;
      Vec_IntPush(pVVar5,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * 0x55555556);
      iVar3 = iVar3 + 1;
    } while (iVar3 < pIfMan->vCis->nSize);
  }
  pVVar10 = pIfMan->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      puVar2 = (uint *)pVVar10->pArray[lVar15];
      uVar1 = *puVar2;
      if ((uVar1 & 0xf) == 4) {
        iVar3 = *(int *)(*(long *)(puVar2 + 6) + 4);
        if (((long)iVar3 < 0) || (pVVar5->nSize <= iVar3)) goto LAB_002c728b;
        uVar16 = pVVar5->pArray[iVar3];
        if ((int)uVar16 < 0) goto LAB_002c72aa;
        iVar3 = *(int *)(*(long *)(puVar2 + 8) + 4);
        if (((long)iVar3 < 0) || (pVVar5->nSize <= iVar3)) goto LAB_002c728b;
        uVar18 = pVVar5->pArray[iVar3];
        if ((int)uVar18 < 0) goto LAB_002c72aa;
        pGVar8 = Gia_ManAppendObj(p);
        uVar12 = uVar16 >> 1;
        iVar3 = p->nObjs;
        if (iVar3 <= (int)uVar12) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x2a2,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar4 = uVar18 >> 1;
        if (iVar3 <= (int)uVar4) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x2a3,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if ((uVar12 == uVar4) && (p->fGiaSimple == 0)) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x2a4,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar16 = uVar16 ^ uVar1 >> 4 & 1;
        uVar18 = uVar18 ^ uVar1 >> 5 & 1;
        iVar11 = (int)pGVar8;
        if ((int)uVar16 < (int)uVar18) {
          pGVar7 = p->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + iVar3 <= pGVar8)) goto LAB_002c726c;
          uVar9 = *(ulong *)pGVar8;
          uVar14 = (ulong)((uVar16 & 1) << 0x1d |
                          ((uint)(iVar11 - (int)pGVar7) >> 2) * -0x55555555 - uVar12 & 0x1fffffff);
          *(ulong *)pGVar8 = uVar14 | uVar9 & 0xffffffffc0000000;
          pGVar7 = p->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + p->nObjs <= pGVar8)) goto LAB_002c726c;
          uVar13 = (ulong)(((uint)(iVar11 - (int)pGVar7) >> 2) * -0x55555555 - uVar4 & 0x1fffffff)
                   << 0x20;
          *(ulong *)pGVar8 = uVar14 | uVar9 & 0xe0000000c0000000 | uVar13;
          uVar19 = (ulong)(uVar18 & 1) << 0x3d;
          uVar13 = uVar14 | uVar9 & 0xc0000000c0000000 | uVar13;
        }
        else {
          pGVar7 = p->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + iVar3 <= pGVar8)) goto LAB_002c726c;
          uVar14 = (ulong)(((uint)(iVar11 - (int)pGVar7) >> 2) * -0x55555555 - uVar12 & 0x1fffffff)
                   << 0x20;
          uVar9 = *(ulong *)pGVar8;
          uVar17 = (ulong)(uVar16 & 1) << 0x3d;
          *(ulong *)pGVar8 = uVar17 | uVar9 & 0xc0000000ffffffff | uVar14;
          pGVar7 = p->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + p->nObjs <= pGVar8)) goto LAB_002c726c;
          uVar13 = (ulong)(((uint)(iVar11 - (int)pGVar7) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
          *(ulong *)pGVar8 = uVar17 | uVar9 & 0xc0000000e0000000 | uVar14 | uVar13;
          uVar19 = (ulong)((uVar18 & 1) << 0x1d);
          uVar13 = uVar17 | uVar9 & 0xc0000000c0000000 | uVar14 | uVar13;
        }
        *(ulong *)pGVar8 = uVar13 | uVar19;
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar8 + -(uVar13 & 0x1fffffff),pGVar8);
          Gia_ObjAddFanout(p,pGVar8 + -((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff),pGVar8);
        }
        if (p->fSweeper != 0) {
          uVar14 = *(ulong *)pGVar8 & 0x1fffffff;
          uVar9 = *(ulong *)pGVar8 >> 0x20 & 0x1fffffff;
          uVar17 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar8 + -uVar14) >> 0x1e & 1) == 0) {
            uVar17 = 0x40000000;
          }
          *(ulong *)(pGVar8 + -uVar14) = uVar17 | *(ulong *)(pGVar8 + -uVar14);
          uVar17 = *(ulong *)(pGVar8 + -uVar9);
          uVar13 = 0x4000000000000000;
          if (((uint)uVar17 >> 0x1e & 1) == 0) {
            uVar13 = 0x40000000;
          }
          *(ulong *)(pGVar8 + -uVar9) = uVar13 | uVar17;
          uVar9 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 =
               uVar9 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar9 >> 0x3d) ^ (uint)(uVar17 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar8 + -uVar14) >> 0x3f) ^
                      (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
        }
        if (p->fBuiltInSim != 0) {
          uVar9 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 =
               uVar9 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar9 >> 0x3d) ^
                       (uint)((ulong)*(undefined8 *)(pGVar8 + -(uVar9 >> 0x20 & 0x1fffffff)) >> 0x3f
                             )) &
                      ((uint)((ulong)*(undefined8 *)(pGVar8 + -(uVar9 & 0x1fffffff)) >> 0x3f) ^
                      (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
          pGVar7 = p->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + p->nObjs <= pGVar8)) goto LAB_002c726c;
          Gia_ManBuiltInSimPerform(p,(int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * -0x55555555)
          ;
        }
        if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
          Gia_ManQuantSetSuppAnd(p,pGVar8);
        }
        pGVar7 = p->pObjs;
        if ((pGVar8 < pGVar7) || (pGVar7 + p->nObjs <= pGVar8)) goto LAB_002c726c;
        Vec_IntPush(pVVar5,(int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * 0x55555556);
      }
      lVar15 = lVar15 + 1;
      pVVar10 = pIfMan->vObjs;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = pIfMan->vCos;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar3 = *(int *)(*(long *)((long)pVVar10->pArray[lVar15] + 0x18) + 4);
      if (((long)iVar3 < 0) || (pVVar5->nSize <= iVar3)) {
LAB_002c728b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = pVVar5->pArray[iVar3];
      if ((int)uVar1 < 0) {
LAB_002c72aa:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar16 = uVar1 >> 1;
      if (p->nObjs <= (int)uVar16) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p->pObjs + uVar16) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar16) < 0
         ) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar18 = *pVVar10->pArray[lVar15];
      pGVar7 = Gia_ManAppendObj(p);
      uVar9 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar9 | 0x80000000;
      pGVar8 = p->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p->nObjs <= pGVar7)) {
LAB_002c726c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (ulong)(((uint)((int)pGVar7 - (int)pGVar8) >> 2) * -0x55555555 - uVar16 & 0x1fffffff)
      ;
      uVar17 = (ulong)(((uVar18 >> 4 ^ uVar1) & 1) << 0x1d);
      *(ulong *)pGVar7 = uVar17 | uVar9 & 0xffffffffc0000000 | 0x80000000 | uVar14;
      *(ulong *)pGVar7 =
           uVar17 | uVar9 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p->nObjs <= pGVar7)) goto LAB_002c726c;
      Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * -0x55555555);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pGVar7);
      }
      pGVar8 = p->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p->nObjs <= pGVar7)) goto LAB_002c726c;
      Vec_IntPush(pVVar5,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * 0x55555556);
      lVar15 = lVar15 + 1;
      pVVar10 = pIfMan->vCos;
    } while (lVar15 < pVVar10->nSize);
  }
  if (pVVar5->nSize == pIfMan->vObjs->nSize) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (int *)0x0;
    }
    free(pVVar5);
    pVVar5 = Gia_ManComputeSwitchProbs(p,0x30,0x10,0);
    pIfMan->vSwitching = pVVar5;
    Gia_ManStop(p);
    if (pIfMan->pPars->fVerbose != 0) {
      iVar11 = 3;
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      lVar15 = lVar15 + local_38;
      Abc_Print(iVar11,"%s =","Computing switching activity");
      Abc_Print(iVar11,"%9.2f sec\n",(double)lVar15 / 1000000.0);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vCopy) == If_ManObjNum(pIfMan)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                ,0x57,"void If_ManComputeSwitching(If_Man_t *)");
}

Assistant:

void If_ManComputeSwitching( If_Man_t * pIfMan )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vCopy;
    If_Obj_t * pIfObj;
    int i;
    assert( pIfMan->vSwitching == NULL );
    // create the new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    vCopy = Vec_IntAlloc( If_ManObjNum(pIfMan) );
    // constant and inputs
    Vec_IntPush( vCopy, 1 );
    If_ManForEachCi( pIfMan, pIfObj, i )
        Vec_IntPush( vCopy, Gia_ManAppendCi(pNew) );
    // internal nodes
    If_ManForEachNode( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        int iLit1 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin1(pIfObj)->Id), If_ObjFaninC1(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendAnd(pNew, iLit0, iLit1) );
    }
    // outputs
    If_ManForEachCo( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendCo(pNew, iLit0) );
    }
    assert( Vec_IntSize(vCopy) == If_ManObjNum(pIfMan) );
    Vec_IntFree( vCopy );
    // compute switching activity
    pIfMan->vSwitching = Gia_ManComputeSwitchProbs( pNew, 48, 16, 0 );
    Gia_ManStop( pNew );
    if ( pIfMan->pPars->fVerbose )
        Abc_PrintTime( 1, "Computing switching activity", Abc_Clock() - clk );
}